

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int cm_expat_XML_ParseBuffer(XML_Parser parser,int len,int isFinal)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  *(undefined8 *)((long)parser + 0x228) = *(undefined8 *)((long)parser + 0x30);
  lVar3 = *(long *)((long)parser + 0x38) + (long)len;
  *(long *)((long)parser + 0x38) = lVar3;
  *(long *)((long)parser + 0x48) = *(long *)((long)parser + 0x48) + (long)len;
  *(long *)((long)parser + 0x50) = lVar3;
  iVar4 = 0;
  lVar2 = (long)parser + 0x30;
  if (isFinal != 0) {
    lVar2 = 0;
  }
  iVar1 = (**(code **)((long)parser + 0x208))
                    (parser,*(undefined8 *)((long)parser + 0x30),lVar3,lVar2);
  *(int *)((long)parser + 0x210) = iVar1;
  if (iVar1 == 0) {
    iVar4 = 1;
    if (isFinal == 0) {
      (**(code **)(*(long *)((long)parser + 0x118) + 0x68))
                (*(long *)((long)parser + 0x118),*(undefined8 *)((long)parser + 0x228),
                 *(undefined8 *)((long)parser + 0x30),(long)parser + 0x408);
    }
  }
  else {
    *(undefined8 *)((long)parser + 0x220) = *(undefined8 *)((long)parser + 0x218);
    *(code **)((long)parser + 0x208) = errorProcessor;
  }
  return iVar4;
}

Assistant:

int XML_ParseBuffer(XML_Parser parser, int len, int isFinal)
{
  const char *start = bufferPtr;
  positionPtr = start;
  bufferEnd += len;
  parseEndByteIndex += len;
  errorCode = processor(parser, start, parseEndPtr = bufferEnd,
                        isFinal ? (const char **)0 : &bufferPtr);
  if (errorCode == XML_ERROR_NONE) {
    if (!isFinal)
      XmlUpdatePosition(encoding, positionPtr, bufferPtr, &position);
    return 1;
  }
  else {
    eventEndPtr = eventPtr;
    processor = errorProcessor;
    return 0;
  }
}